

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_rom.h
# Opt level: O0

nes_cartridge * nes_rom_load_cartridge(char *path)

{
  FILE *__stream;
  size_t __size;
  void *__ptr;
  size_t rom_file_size;
  void *rom_file_data;
  FILE *rom_file;
  nes_cartridge *cartridge;
  char *path_local;
  
  rom_file = (FILE *)0x0;
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    perror("Failed to load NES ROM");
  }
  else {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    fseek(__stream,0,0);
    __ptr = malloc(__size);
    fread(__ptr,__size,1,__stream);
    rom_file = (FILE *)nes_rom_create_cartridge(__ptr,__size);
    free(__ptr);
    fclose(__stream);
  }
  return (nes_cartridge *)rom_file;
}

Assistant:

static nes_cartridge* nes_rom_load_cartridge(const char* path)
{
    nes_cartridge* cartridge = 0;

#if _WIN32
    FILE* rom_file = NULL;
    if (fopen_s(&rom_file, path, "rb") == 0)
#else
    FILE* rom_file = fopen(path, "rb");
    if (rom_file)
#endif
    {
        void*   rom_file_data = 0;
        size_t  rom_file_size = 0; 

        fseek(rom_file, 0, SEEK_END);
        rom_file_size = ftell(rom_file);
        fseek(rom_file, 0, SEEK_SET);

        rom_file_data = malloc(rom_file_size);
        fread(rom_file_data, rom_file_size, 1, rom_file);

        cartridge = nes_rom_create_cartridge(rom_file_data, rom_file_size);
        free(rom_file_data);

        fclose(rom_file);
    }
    else
    {
        perror("Failed to load NES ROM");
    }

    return cartridge;
}